

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O1

void Execute(function<int_(int)> *function)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  function<int_(int)> *function_00;
  int iVar4;
  int iVar5;
  int *in_RSI;
  function<int_(int)> *function_01;
  undefined1 auVar6 [16];
  _Any_data _Stack_98;
  code *pcStack_88;
  _Any_data _Stack_78;
  code *pcStack_68;
  long lStack_58;
  function<int_(int)> *pfStack_50;
  char local_3e [2];
  int local_3c;
  double local_38;
  double dStack_30;
  
  iVar4 = 0;
  pfStack_50 = (function<int_(int)> *)0x103270;
  function_01 = function;
  lVar1 = std::chrono::_V2::system_clock::now();
  do {
    iVar5 = (int)in_RSI;
    local_3c = iVar4;
    if ((function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      pfStack_50 = (function<int_(int)> *)ExecuteWithWrapping;
      std::__throw_bad_function_call();
      lStack_58 = lVar1;
      pfStack_50 = function;
      if (0 < iVar5) {
        std::function<int_(int)>::function((function<int_(int)> *)&_Stack_78,function_01);
        capture_thread::ThreadCrosser::WrapFunction<int,int>
                  ((function<int_(int)> *)&_Stack_98,(ThreadCrosser *)&_Stack_78,function_00);
        ExecuteWithWrapping((function<int_(int)> *)&_Stack_98,iVar5 + -1);
        if (pcStack_88 != (code *)0x0) {
          (*pcStack_88)(&_Stack_98,&_Stack_98,__destroy_functor);
        }
        if (pcStack_68 != (code *)0x0) {
          (*pcStack_68)(&_Stack_78,&_Stack_78,__destroy_functor);
        }
        return;
      }
      Execute(function_01);
      return;
    }
    pfStack_50 = (function<int_(int)> *)0x103291;
    in_RSI = &local_3c;
    function_01 = function;
    (*function->_M_invoker)((_Any_data *)function,&local_3c);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 1000000);
  pfStack_50 = (function<int_(int)> *)0x1032a0;
  lVar2 = std::chrono::_V2::system_clock::now();
  auVar6._0_8_ = (double)lVar2;
  auVar6._8_8_ = (double)lVar1;
  auVar6 = divpd(auVar6,_DAT_00104010);
  dStack_30 = auVar6._8_8_;
  local_38 = (auVar6._0_8_ - dStack_30) * 1000.0;
  local_3e[0] = '\t';
  pfStack_50 = (function<int_(int)> *)0x1032ea;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3e,1);
  pfStack_50 = (function<int_(int)> *)0x1032f7;
  poVar3 = std::ostream::_M_insert<double>(local_38);
  local_3e[1] = 9;
  pfStack_50 = (function<int_(int)> *)0x10330b;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3e + 1,1);
  pfStack_50 = (function<int_(int)> *)0x103321;
  poVar3 = std::ostream::_M_insert<double>(local_38 / 1000000.0);
  pfStack_50 = (function<int_(int)> *)0x103338;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  pfStack_50 = (function<int_(int)> *)0x103343;
  std::ostream::put((char)poVar3);
  pfStack_50 = (function<int_(int)> *)0x10334b;
  std::ostream::flush();
  return;
}

Assistant:

void Execute(const std::function<int(int)>& function) {
  const auto start_time = GetCurrentTime();
  for (int i = 0; i < kIterations; ++i) {
    function(i);
  }
  const auto finish_time = GetCurrentTime();
  const double elapsed_ms = 1000. * (finish_time - start_time).count();
  std::cout << '\t' << elapsed_ms << '\t' << elapsed_ms / kIterations
            << std::endl;
}